

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

fdb_status
filemgr_read(filemgr *file,bid_t bid,void *buf,err_log_callback *log_callback,
            bool read_on_cache_miss)

{
  uint uVar1;
  bid_t bVar2;
  int iVar3;
  fdb_status fVar4;
  fdb_status io_error;
  plock_entry_t *plock_entry;
  __int_type _Var5;
  ulong uVar6;
  uint64_t buflen;
  size_t sVar7;
  char *pcVar8;
  char *format;
  long lVar9;
  plock *plock;
  err_log_callback *log_callback_00;
  long *in_FS_OFFSET;
  bool bVar10;
  char *pcVar11;
  bid_t bid_local;
  void *local_80;
  plock *local_78;
  plock_entry_t *local_70;
  err_log_callback *local_68;
  bid_t is_writer;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  bid_local = bid;
  if ((char)in_FS_OFFSET[-0x19] == '\0') {
    filemgr_read_cold_1();
  }
  if ((char)in_FS_OFFSET[-0x13] == '\0') {
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc:2033:31)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc:2033:31)>
               ::_M_manager;
    *(undefined1 *)(in_FS_OFFSET + -0x18) = 0;
    std::function<void_()>::function
              ((function<void_()> *)(*in_FS_OFFSET + -0xb8),(function<void_()> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    __cxa_thread_atexit(FdbGcFunc::~FdbGcFunc,*in_FS_OFFSET + -0xc0,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x13) = 1;
  }
  bVar2 = bid_local;
  pcVar8 = (char *)(file->blocksize * bid);
  pcVar11 = (char *)(file->pos).super___atomic_base<unsigned_long>._M_i;
  if (pcVar8 < pcVar11) {
    if (0 < global_config.ncacheblock) {
      is_writer = 0;
      iVar3 = bcache_read(file,bid_local,buf);
      if (iVar3 != 0) {
        return FDB_RESULT_SUCCESS;
      }
      plock = &file->plock;
      local_68 = log_callback;
      plock_entry = plock_lock(plock,&bid_local,&is_writer);
      iVar3 = bcache_read(file,bid_local,buf);
      log_callback_00 = local_68;
      if (iVar3 == 0) {
        local_80 = buf;
        local_78 = plock;
        local_70 = plock_entry;
        if (!read_on_cache_miss) {
          plock_unlock(plock,plock_entry);
          format = 
          "Read error: BID %lu in a database file \'%s\' doesn\'t exist in the cache and read_on_cache_miss flag is turned on.\n"
          ;
          sVar7 = 0x821;
          pcVar11 = file->filename;
          log_callback = local_68;
          pcVar8 = (char *)bid_local;
          goto LAB_0011e9b9;
        }
        if ((file->latest_filesize).super___atomic_base<unsigned_long>._M_i / (ulong)file->blocksize
            <= bid_local) {
          lVar9 = 0;
          do {
            _Var5 = (*file->ops->goto_eof)(file->fd);
            LOCK();
            (file->latest_filesize).super___atomic_base<unsigned_long>._M_i = _Var5;
            UNLOCK();
            uVar6 = (file->latest_filesize).super___atomic_base<unsigned_long>._M_i;
            uVar1 = file->blocksize;
            bVar10 = lVar9 != 0;
            lVar9 = lVar9 + -1;
            if (bVar10) {
              usleep(1000);
            }
          } while (uVar6 / uVar1 <= bid_local);
        }
        if (((void *)in_FS_OFFSET[-0x1a] == (void *)0x0) ||
           (global_config.num_blocks_readahead == 0)) {
          uVar6 = filemgr_read_block(file,buf,bid_local);
          plock_entry = local_70;
          plock = local_78;
          if (uVar6 == file->blocksize) {
            fVar4 = _filemgr_crc32_check(file,buf);
            if (fVar4 != FDB_RESULT_SUCCESS) {
              _log_errno_str(file->ops,log_callback_00,fVar4,"READ",file->filename);
              plock_unlock(plock,plock_entry);
              fdb_log_impl(log_callback_00,2,fVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                           ,"filemgr_read",0x85b,
                           "Read error: checksum error on BID %lu in a database file \'%s\' : marker %x\n"
                           ,bid_local,file->filename,
                           (ulong)*(byte *)((long)buf + ((ulong)file->blocksize - 1)));
              if ((log_callback_00 != (err_log_callback *)0x0) &&
                 (log_callback_00->callback != (fdb_log_callback)0x0)) {
                return fVar4;
              }
              buflen = (uint64_t)file->blocksize;
              goto LAB_0011eb40;
            }
            if (((global_config.do_not_cache_doc_blocks == true) &&
                (*(char *)((long)buf + ((ulong)file->blocksize - 1)) != -1)) ||
               (io_error = bcache_write(file,bid_local,buf,BCACHE_REQ_CLEAN,false,false),
               io_error == global_config.blocksize)) goto LAB_0011e973;
            plock_unlock(plock,plock_entry);
            log_callback_00 = local_68;
            _log_errno_str(file->ops,local_68,io_error,"WRITE",file->filename);
            fVar4 = FDB_RESULT_WRITE_FAIL;
            if (io_error < FDB_RESULT_SUCCESS) {
              fVar4 = io_error;
            }
            fdb_log_impl(log_callback_00,2,fVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                         ,"filemgr_read",0x876,
                         "Read error: BID %lu in a database file \'%s\' is not written in cache correctly: only %d bytes written.\n"
                         ,bid_local,file->filename,(long)io_error);
          }
          else {
            _log_errno_str(file->ops,log_callback_00,(fdb_status)uVar6,"READ",file->filename);
            plock_unlock(plock,plock_entry);
            fVar4 = FDB_RESULT_READ_FAIL;
            if ((long)uVar6 < 0) {
              fVar4 = (fdb_status)uVar6;
            }
            fdb_log_impl(log_callback_00,2,fVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                         ,"filemgr_read",0x849,
                         "Read error: BID %lu in a database file \'%s\' is not read correctly: only %d bytes read, file size %zu.\n"
                         ,bid_local,file->filename,uVar6,
                         (file->latest_filesize).super___atomic_base<unsigned_long>._M_i);
          }
          if ((log_callback_00 != (err_log_callback *)0x0) &&
             (log_callback_00->callback != (fdb_log_callback)0x0)) {
            return fVar4;
          }
          buflen = (uint64_t)file->blocksize;
          buf = local_80;
          goto LAB_0011eb40;
        }
        fVar4 = filemgr_do_readahead(file,bid_local,buf,(void *)in_FS_OFFSET[-0x1a],log_callback_00)
        ;
        plock_entry = local_70;
        plock = local_78;
        if (fVar4 != FDB_RESULT_SUCCESS) {
          return fVar4;
        }
      }
LAB_0011e973:
      plock_unlock(plock,plock_entry);
      return FDB_RESULT_SUCCESS;
    }
    if (read_on_cache_miss) {
      uVar6 = filemgr_read_block(file,buf,bid_local);
      if (uVar6 == file->blocksize) {
        if (*(char *)((long)buf + (uVar6 - 1)) != -1) {
          return FDB_RESULT_SUCCESS;
        }
        uVar1 = *(uint *)((long)buf + 8);
        *(undefined8 *)((long)buf + 8) = 0xffffffffffffffff;
        bVar10 = perform_integrity_check
                           ((uint8_t *)buf,(ulong)file->blocksize,
                            uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                            uVar1 << 0x18,file->crc_mode);
        if (bVar10) {
          return FDB_RESULT_SUCCESS;
        }
        fVar4 = FDB_RESULT_CHECKSUM_ERROR;
        _log_errno_str(file->ops,log_callback,FDB_RESULT_CHECKSUM_ERROR,"READ",file->filename);
        uVar6 = (ulong)*(byte *)((long)buf + ((ulong)file->blocksize - 1));
        sVar7 = 0x8a1;
        pcVar11 = file->filename;
        pcVar8 = 
        "Read error: checksum error on BID %lu in a database file \'%s\' : marker %x (block cache disabled)\n"
        ;
      }
      else {
        _log_errno_str(file->ops,log_callback,(fdb_status)uVar6,"READ",file->filename);
        fVar4 = FDB_RESULT_READ_FAIL;
        if ((long)uVar6 < 0) {
          fVar4 = (fdb_status)uVar6;
        }
        sVar7 = 0x892;
        pcVar11 = file->filename;
        pcVar8 = 
        "Read error: BID %lu in a database file \'%s\' is not read correctly: only %d bytes read (block cache disabled).\n"
        ;
      }
      fdb_log_impl(log_callback,2,fVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_read",sVar7,pcVar8,bVar2,pcVar11,uVar6);
      if ((log_callback != (err_log_callback *)0x0) &&
         (log_callback->callback != (fdb_log_callback)0x0)) {
        return fVar4;
      }
      buflen = (uint64_t)file->blocksize;
LAB_0011eb40:
      dbg_print_buf(buf,buflen,true,0x10);
      return fVar4;
    }
    format = "Read error: BID %lu in a database file \'%s\':block cache is not enabled.\n";
    sVar7 = 0x886;
    pcVar11 = file->filename;
    pcVar8 = (char *)bid_local;
  }
  else {
    sVar7 = 0x7fd;
    format = 
    "Read error: read offset %lu exceeds the file\'s current offset %lu in a database file \'%s\'\n"
    ;
  }
LAB_0011e9b9:
  fdb_log_impl(log_callback,2,FDB_RESULT_READ_FAIL,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
               ,"filemgr_read",sVar7,format,pcVar8,pcVar11);
  return FDB_RESULT_READ_FAIL;
}

Assistant:

fdb_status filemgr_read(struct filemgr *file, bid_t bid, void *buf,
                        err_log_callback *log_callback,
                        bool read_on_cache_miss)
{
    thread_local void* buf_aligned = alloc_buf_for_readahead();
    thread_local FdbGcFunc gc([&](){ free_align(buf_aligned); });

    size_t lock_no;
    ssize_t r;
    uint64_t pos = bid * file->blocksize;
    fdb_status status = FDB_RESULT_SUCCESS;
    uint64_t curr_pos = atomic_get_uint64_t(&file->pos);

    if (pos >= curr_pos) {
        const char *msg = "Read error: read offset %" _F64 " exceeds the file's "
                          "current offset %" _F64 " in a database file '%s'\n";
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                msg, pos, curr_pos, file->filename);
        return FDB_RESULT_READ_FAIL;
    }

    if (global_config.ncacheblock > 0) {
        lock_no = bid % DLOCK_MAX;
        (void)lock_no;

        plock_entry_t *plock_entry = NULL;
        bid_t is_writer = 0;
        bool locked = false; (void)locked;

        r = bcache_read(file, bid, buf);
        if (r == 0) {
            // Cache miss, grab lock and find once again.

            // WARNING:
            //   Regardless of writability, we SHOULD grab lock
            //   as reused blocks are immutable but writers can overwrite it
            //   and can update block cache sooner. Once race condition happens,
            //   reader may overwrite it using previous block.
            plock_entry = plock_lock(&file->plock, &bid, &is_writer);
            locked = true;
            r = bcache_read(file, bid, buf);
        }

        if (r == 0) {
            // Still cache miss, read from file.
            if (!read_on_cache_miss) {
                if (locked) {
                    plock_unlock(&file->plock, plock_entry);
                }
                const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                    "doesn't exist in the cache and read_on_cache_miss "
                    "flag is turned on.\n";
                fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                        msg, bid, file->filename);
                return FDB_RESULT_READ_FAIL;
            }

            uint64_t total_blocks = atomic_get_uint64_t(&file->latest_filesize) /
                                    file->blocksize;
            size_t wait_count = 0;
            while (bid >= total_blocks) {
                // This means blocks are asynchronously flushed from cache.
                // Should update file size.
                cs_off_t exp_filesize = file->ops->goto_eof(file->fd);
                atomic_init_uint64_t(&file->latest_filesize, exp_filesize);
                total_blocks = atomic_get_uint64_t(&file->latest_filesize) /
                               file->blocksize;
                if (wait_count++) {
                    usleep(1000);
                }
            }

            if ( buf_aligned &&
                 global_config.num_blocks_readahead ) {
                // Direct-IO mode, do read-ahead.
                status = filemgr_do_readahead(file, bid, buf, buf_aligned, log_callback);
                if (status != FDB_RESULT_SUCCESS) return status;

            } else {
                // if normal file, just read a block
                r = filemgr_read_block(file, buf, bid);
                if (r != (ssize_t)file->blocksize) {
                    _log_errno_str(file->ops, log_callback,
                                   (fdb_status) r, "READ", file->filename);
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    const char *msg = "Read error: BID %" _F64
                        " in a database file '%s' is not read correctly: "
                        "only %d bytes read, file size %zu.\n";
                    status = r < 0 ? (fdb_status)r : FDB_RESULT_READ_FAIL;
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid, file->filename, r,
                            atomic_get_uint64_t(&file->latest_filesize));
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }

                status = _filemgr_crc32_check(file, buf);
                if (status != FDB_RESULT_SUCCESS) {
                    _log_errno_str(file->ops, log_callback, status, "READ",
                            file->filename);
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    const char *msg = "Read error: checksum error on BID %" _F64
                        " in a database file '%s' : marker %x\n";
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid,
                            file->filename, *((uint8_t*)buf + file->blocksize-1));
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }

                uint8_t marker = *((uint8_t*)buf + file->blocksize - 1);
                if ( global_config.do_not_cache_doc_blocks &&
                     marker != BLK_MARKER_BNODE ) {
                    // If caching option is ON, and not a B-tree block,
                    // we do not put it into cache.
                    r = global_config.blocksize;
                } else {
                    r = bcache_write(file, bid, buf, BCACHE_REQ_CLEAN, false, false);
                }

                if (r != global_config.blocksize) {
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    _log_errno_str(file->ops, log_callback,
                                   (fdb_status) r, "WRITE", file->filename);
                    const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                        "is not written in cache correctly: only %d bytes written.\n";
                    status = r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
                    fdb_log(log_callback, FDB_LOG_ERROR, status,
                            msg, bid, file->filename, r);
                    if (!log_callback || !log_callback->callback) {
                        dbg_print_buf(buf, file->blocksize, true, 16);
                    }
                    return status;
                }
            }
        }
        if (locked) {
            plock_unlock(&file->plock, plock_entry);
        }
    } else {
        if (!read_on_cache_miss) {
            const char *msg = "Read error: BID %" _F64 " in a database file '%s':"
                "block cache is not enabled.\n";
            fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                    msg, bid, file->filename);
            return FDB_RESULT_READ_FAIL;
        }

        r = filemgr_read_block(file, buf, bid);
        if (r != (ssize_t)file->blocksize) {
            _log_errno_str(file->ops, log_callback, (fdb_status) r, "READ",
                           file->filename);
            const char *msg = "Read error: BID %" _F64 " in a database file '%s' "
                "is not read correctly: only %d bytes read (block cache disabled).\n";
            status = (r < 0)? (fdb_status)r : FDB_RESULT_READ_FAIL;
            fdb_log(log_callback, FDB_LOG_ERROR, status,
                    msg, bid, file->filename, r);
            if (!log_callback || !log_callback->callback) {
                dbg_print_buf(buf, file->blocksize, true, 16);
            }
            return status;
        }

        status = _filemgr_crc32_check(file, buf);
        if (status != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, status, "READ",
                           file->filename);
            const char *msg = "Read error: checksum error on BID %" _F64 " in a database file '%s' "
                ": marker %x (block cache disabled)\n";
            fdb_log(log_callback, FDB_LOG_ERROR, status,
                    msg, bid,
                    file->filename, *((uint8_t*)buf + file->blocksize-1));
            if (!log_callback || !log_callback->callback) {
                dbg_print_buf(buf, file->blocksize, true, 16);
            }
            return status;
        }

    }
    return status;
}